

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Statement * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,IfStatement *i)

{
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  IfStatement *pIVar4;
  IfStatement *pIVar5;
  pool_ptr<soul::AST::Constant> constant;
  long local_70;
  PackedData local_68;
  CompileMessage local_50;
  
  if (i->isConstIf == true) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&i->condition);
  }
  else {
    pIVar5 = (IfStatement *)
             ErrorIgnoringRewritingASTVisitor::visit
                       (&this->super_ErrorIgnoringRewritingASTVisitor,i);
    if (pIVar5 != i) {
      throwInternalCompilerError("std::addressof (result) == std::addressof (i)","visit",0x694);
    }
  }
  (*(((i->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_70);
  if (local_70 == 0) {
    pIVar5 = i;
    if (i->isConstIf == true) {
      if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
        pEVar2 = (i->condition).object;
        CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Expected a constant value");
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false)
        ;
      }
      psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
      *psVar1 = *psVar1 + 1;
    }
  }
  else {
    soul::Value::getData(&local_68,(Value *)(local_70 + 0x30));
    bVar3 = soul::Value::PackedData::getAsBool(&local_68);
    if (bVar3) {
      pIVar4 = (IfStatement *)
               RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,(i->trueBranch).object);
      pIVar5 = (IfStatement *)(i->trueBranch).object;
      if (pIVar5 != pIVar4) {
        psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.
                  itemsReplaced;
        *psVar1 = *psVar1 + 1;
        (i->trueBranch).object = (Statement *)pIVar4;
        pIVar5 = pIVar4;
      }
    }
    else if ((i->falseBranch).object == (Statement *)0x0) {
      pIVar5 = (IfStatement *)
               PoolAllocator::allocate<soul::AST::NoopStatement,soul::AST::Context&>
                         (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                          &(i->super_Statement).super_ASTObject.context);
    }
    else {
      RewritingASTVisitor::replaceStatement((RewritingASTVisitor *)this,&i->falseBranch);
      pIVar5 = (IfStatement *)(i->falseBranch).object;
      if (pIVar5 == (IfStatement *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
    }
  }
  return &pIVar5->super_Statement;
}

Assistant:

AST::Statement& visit (AST::IfStatement& i) override
        {
            if (i.isConstIf)
            {
                replaceExpression (i.condition);
            }
            else
            {
                auto& result = super::visit (i);
                SOUL_ASSERT (std::addressof (result) == std::addressof (i));
            }

            if (auto constant = i.condition->getAsConstant())
            {
                if (constant->value.getAsBool())
                {
                    replaceStatement (i.trueBranch);
                    return i.trueBranch;
                }

                if (i.falseBranch != nullptr)
                {
                    replaceStatement (i.falseBranch);
                    return *i.falseBranch;
                }

                return allocator.allocate<AST::NoopStatement> (i.context);
            }

            if (i.isConstIf)
            {
                if (! ignoreErrors)
                    i.condition->context.throwError (Errors::expectedConstant());
                else
                    ++numFails;
            }

            return i;
        }